

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O0

void Msat_MmStepEntryRecycle(Msat_MmStep_t *p,char *pEntry,int nBytes)

{
  int nBytes_local;
  char *pEntry_local;
  Msat_MmStep_t *p_local;
  
  if (nBytes != 0) {
    if (p->nMapSize < nBytes) {
      if (pEntry != (char *)0x0) {
        free(pEntry);
      }
    }
    else {
      Msat_MmFixedEntryRecycle(p->pMap[nBytes],pEntry);
    }
  }
  return;
}

Assistant:

void Msat_MmStepEntryRecycle( Msat_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
        ABC_FREE( pEntry );
        return;
    }
    Msat_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}